

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  bool bVar1;
  char *pcVar2;
  _Alloc_hider s;
  pointer s_00;
  string mapProp;
  string locProp;
  string impProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  allocator local_b9;
  cmTarget *local_b8;
  char **local_b0;
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    return true;
  }
  local_b8 = this;
  local_b0 = imp;
  std::__cxx11::string::assign((char *)suffix);
  std::__cxx11::string::append((string *)suffix);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_a8,"MAP_IMPORTED_CONFIG_",(allocator *)&local_88);
  std::__cxx11::string::append((string *)&local_a8);
  pcVar2 = GetProperty(local_b8,&local_a8);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_88,pcVar2,(allocator *)&local_68);
    cmSystemTools::ExpandListArgument(&local_88,&local_48,false);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = HasImportLibrary(local_b8);
  s_00 = local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (*loc != (char *)0x0) goto LAB_0036f09e;
    pcVar2 = *local_b0;
    if ((pcVar2 != (char *)0x0) ||
       (s_00 == local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) break;
    cmsys::SystemTools::UpperCase(&local_a8,s_00);
    std::__cxx11::string::string((string *)&local_88,"IMPORTED_LOCATION_",(allocator *)&local_68);
    std::__cxx11::string::append((string *)&local_88);
    pcVar2 = GetProperty(local_b8,&local_88);
    *loc = pcVar2;
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_68,"IMPORTED_IMPLIB_",&local_b9);
      std::__cxx11::string::append((string *)&local_68);
      pcVar2 = GetProperty(local_b8,&local_68);
      *local_b0 = pcVar2;
      std::__cxx11::string::~string((string *)&local_68);
      pcVar2 = *loc;
    }
    if ((pcVar2 != (char *)0x0) || (*local_b0 != (char *)0x0)) {
      std::__cxx11::string::assign((char *)suffix);
      std::__cxx11::string::append((string *)suffix);
    }
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    s_00 = s_00 + 1;
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_a8,"IMPORTED_LOCATION",(allocator *)&local_88);
      std::__cxx11::string::append((string *)&local_a8);
      pcVar2 = GetProperty(local_b8,&local_a8);
      *loc = pcVar2;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_88,"IMPORTED_IMPLIB",(allocator *)&local_68);
        std::__cxx11::string::append((string *)&local_88);
        pcVar2 = GetProperty(local_b8,&local_88);
        *local_b0 = pcVar2;
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)&local_a8);
      if (*loc != (char *)0x0) goto LAB_0036f09e;
    }
  }
  else if (pcVar2 == (char *)0x0) goto LAB_0036edda;
  if (*local_b0 != (char *)0x0) goto LAB_0036f09e;
  std::__cxx11::string::assign((char *)suffix);
  std::__cxx11::string::string((string *)&local_a8,"IMPORTED_LOCATION",(allocator *)&local_88);
  pcVar2 = GetProperty(local_b8,&local_a8);
  *loc = pcVar2;
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_a8,"IMPORTED_IMPLIB",(allocator *)&local_88);
    pcVar2 = GetProperty(local_b8,&local_a8);
    *local_b0 = pcVar2;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((*loc != (char *)0x0) || (*local_b0 != (char *)0x0)) goto LAB_0036f09e;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&local_a8,"IMPORTED_CONFIGURATIONS",(allocator *)&local_88)
  ;
  pcVar2 = GetProperty(local_b8,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_a8,pcVar2,(allocator *)&local_88);
    cmSystemTools::ExpandListArgument
              (&local_a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68,false);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  for (s._M_p = local_68._M_dataplus._M_p;
      ((*loc == (char *)0x0 && (*local_b0 == (char *)0x0)) &&
      (s._M_p != (pointer)local_68._M_string_length)); s._M_p = s._M_p + 0x20) {
    std::__cxx11::string::assign((char *)suffix);
    cmsys::SystemTools::UpperCase(&local_a8,(string *)s._M_p);
    std::__cxx11::string::append((string *)suffix);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string((string *)&local_a8,"IMPORTED_LOCATION",(allocator *)&local_88);
    std::__cxx11::string::append((string *)&local_a8);
    pcVar2 = GetProperty(local_b8,&local_a8);
    *loc = pcVar2;
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_88,"IMPORTED_IMPLIB",&local_b9);
      std::__cxx11::string::append((string *)&local_88);
      pcVar2 = GetProperty(local_b8,&local_88);
      *local_b0 = pcVar2;
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  if ((*loc != (char *)0x0) || (*local_b0 != (char *)0x0)) goto LAB_0036f09e;
LAB_0036edda:
  bVar1 = false;
LAB_0036f0a1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar1;
LAB_0036f09e:
  bVar1 = true;
  goto LAB_0036f0a1;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc,
                               const char** imp,
                               std::string& suffix) const
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    // This method attempts to find a config-specific LOCATION for the
    // IMPORTED library. In the case of cmState::INTERFACE_LIBRARY, there is no
    // LOCATION at all, so leaving *loc and *imp unchanged is the appropriate
    // and valid response.
    return true;
    }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += desired_config;

  std::vector<std::string> mappedConfigs;
  {
  std::string mapProp = "MAP_IMPORTED_CONFIG_";
  mapProp += desired_config;
  if(const char* mapValue = this->GetProperty(mapProp))
    {
    cmSystemTools::ExpandListArgument(mapValue, mappedConfigs);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for(std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
      !*loc && !*imp && mci != mappedConfigs.end(); ++mci)
    {
    // Look for this configuration.
    std::string mcUpper = cmSystemTools::UpperCase(*mci);
    std::string locProp = "IMPORTED_LOCATION_";
    locProp += mcUpper;
    *loc = this->GetProperty(locProp);
    if(allowImp)
      {
      std::string impProp = "IMPORTED_IMPLIB_";
      impProp += mcUpper;
      *imp = this->GetProperty(impProp);
      }

    // If it was found, use it for all properties below.
    if(*loc || *imp)
      {
      suffix = "_";
      suffix += mcUpper;
      }
    }

  // If we needed to find one of the mapped configurations but did not
  // then the target is not found.  The project does not want any
  // other configuration.
  if(!mappedConfigs.empty() && !*loc && !*imp)
    {
    return false;
    }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if(!*loc && !*imp)
    {
    std::string locProp = "IMPORTED_LOCATION";
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if(allowImp)
      {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
      }
    }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if(!*loc && !*imp)
    {
    // The suffix computed above is not useful.
    suffix = "";

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty("IMPORTED_LOCATION");
    if(allowImp)
      {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
    }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if(!*loc && !*imp)
    {
    std::vector<std::string> availableConfigs;
    if(const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS"))
      {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
      }
    for(std::vector<std::string>::const_iterator
          aci = availableConfigs.begin();
        !*loc && !*imp && aci != availableConfigs.end(); ++aci)
      {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = "IMPORTED_LOCATION";
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if(allowImp)
        {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
        }
      }
    }
  // If we have not yet found it then the target is not available.
  if(!*loc && !*imp)
    {
    return false;
    }

  return true;
}